

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O0

bool __thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::_add
          (DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *this,IntervalT *I,RWNode **val,
          bool update)

{
  Offset o;
  initializer_list<dg::dda::RWNode_*> __l;
  initializer_list<dg::dda::RWNode_*> __l_00;
  initializer_list<dg::dda::RWNode_*> __l_01;
  initializer_list<dg::dda::RWNode_*> __l_02;
  bool bVar1;
  pointer ppVar2;
  byte in_CL;
  undefined8 *in_RDX;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *in_RSI;
  DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>,_bool>
  pVar3;
  IntervalT rest;
  iterator it;
  bool changed;
  map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
  *in_stack_fffffffffffffd88;
  Offset *in_stack_fffffffffffffd90;
  undefined7 in_stack_fffffffffffffd98;
  undefined1 in_stack_fffffffffffffd9f;
  undefined1 uVar4;
  pointer in_stack_fffffffffffffda0;
  less<dg::dda::RWNode_*> *in_stack_fffffffffffffda8;
  const_iterator __pos;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
  *in_stack_fffffffffffffdb0;
  RWNode *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  undefined1 uVar5;
  _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
  in_stack_fffffffffffffdc8;
  undefined8 local_218;
  undefined8 *local_210;
  undefined8 local_208;
  _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
  local_1d0;
  _Self local_1c8;
  Offset local_1c0;
  type local_1b8;
  _Base_ptr local_1b0;
  type local_1a8;
  _Base_ptr local_1a0;
  undefined8 local_190;
  undefined8 *local_188;
  undefined8 local_180;
  IntervalT *in_stack_fffffffffffffea0;
  DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *in_stack_fffffffffffffea8;
  Offset local_148;
  type local_140;
  Offset local_138;
  DiscreteInterval<dg::Offset> local_130;
  _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
  local_120;
  _Self local_118;
  _Rb_tree_node_base local_110;
  undefined8 local_e8;
  undefined8 *local_e0;
  undefined8 local_d8;
  _Self local_a0;
  _Self local_98;
  byte local_89;
  _Base_ptr local_88;
  undefined1 local_80;
  undefined8 local_70;
  undefined8 *local_68;
  undefined8 local_60;
  byte local_21;
  undefined8 *local_20;
  set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *local_18
  ;
  bool local_1;
  
  local_21 = in_CL & 1;
  local_20 = in_RDX;
  local_18 = in_RSI;
  bVar1 = std::
          map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
          ::empty((map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
                   *)0x18485c);
  if (bVar1) {
    local_70 = *local_20;
    local_68 = &local_70;
    local_60 = 1;
    std::allocator<dg::dda::RWNode_*>::allocator((allocator<dg::dda::RWNode_*> *)0x1848ae);
    __l._M_len._0_7_ = in_stack_fffffffffffffdc0;
    __l._M_array = (iterator)in_stack_fffffffffffffdb8;
    __l._M_len._7_1_ = in_stack_fffffffffffffdc7;
    std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
    set(in_stack_fffffffffffffdb0,__l,in_stack_fffffffffffffda8,
        (allocator_type *)in_stack_fffffffffffffda0);
    pVar3 = std::
            map<dg::ADT::DiscreteInterval<dg::Offset>,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>,std::less<dg::ADT::DiscreteInterval<dg::Offset>>,std::allocator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
            ::
            emplace<dg::ADT::DiscreteInterval<dg::Offset>const&,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
                      ((map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
                        *)in_stack_fffffffffffffda0,
                       (DiscreteInterval<dg::Offset> *)
                       CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                       (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                        *)in_stack_fffffffffffffd90);
    local_88 = (_Base_ptr)pVar3.first._M_node;
    local_80 = pVar3.second;
    std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
    ~set((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *
         )0x18490e);
    std::allocator<dg::dda::RWNode_*>::~allocator((allocator<dg::dda::RWNode_*> *)0x18491b);
    local_1 = true;
  }
  else {
    local_89 = splitExtBorders(in_stack_fffffffffffffea8,in_stack_fffffffffffffea0);
    _check(in_RDI);
    local_98._M_node =
         (_Base_ptr)
         _find_ge((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)in_stack_fffffffffffffd88
                  ,(IntervalT *)0x18495f);
    local_a0._M_node =
         (_Base_ptr)
         std::
         map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
         ::end(in_stack_fffffffffffffd88);
    bVar1 = std::operator==(&local_98,&local_a0);
    uVar5 = true;
    if (!bVar1) {
      in_stack_fffffffffffffdb8 = (RWNode *)&(local_18->_M_t)._M_impl.super__Rb_tree_header;
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                             *)0x1849b9);
      uVar5 = Offset::operator<((Offset *)in_stack_fffffffffffffdb8,(Offset *)ppVar2);
    }
    if ((bool)uVar5 == false) {
      local_110._0_8_ = *(undefined8 *)&(local_18->_M_t)._M_impl;
      local_110._M_parent = *(_Base_ptr *)&(local_18->_M_t)._M_impl.super__Rb_tree_header._M_header;
      uVar5 = 0;
      while( true ) {
        local_118._M_node =
             (_Base_ptr)
             std::
             map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
             ::end(in_stack_fffffffffffffd88);
        bVar1 = std::operator!=(&local_98,&local_118);
        if (!bVar1) break;
        __pos._M_node = &local_110;
        ppVar2 = std::
                 _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                               *)0x184b03);
        bVar1 = Offset::operator<((Offset *)__pos._M_node,(Offset *)ppVar2);
        if (bVar1) {
          std::
          _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
          ::_Rb_tree_const_iterator(&local_120,&local_98);
          local_138.offset = local_110._0_8_;
          in_stack_fffffffffffffda0 =
               std::
               _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                             *)0x184b4b);
          Offset::Offset(&local_148,1);
          local_140 = (type)Offset::operator-((Offset *)
                                              CONCAT17(in_stack_fffffffffffffd9f,
                                                       in_stack_fffffffffffffd98),
                                              in_stack_fffffffffffffd90);
          DiscreteInterval<dg::Offset>::DiscreteInterval(&local_130,local_138,(Offset)local_140);
          local_190 = *local_20;
          local_188 = &local_190;
          local_180 = 1;
          std::allocator<dg::dda::RWNode_*>::allocator((allocator<dg::dda::RWNode_*> *)0x184bd5);
          __l_01._M_len._0_7_ = in_stack_fffffffffffffdc0;
          __l_01._M_array = (iterator)in_stack_fffffffffffffdb8;
          __l_01._M_len._7_1_ = uVar5;
          std::
          set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
          set(in_stack_fffffffffffffdb0,__l_01,(less<dg::dda::RWNode_*> *)__pos._M_node,
              (allocator_type *)in_stack_fffffffffffffda0);
          local_1a0 = (_Base_ptr)
                      std::
                      map<dg::ADT::DiscreteInterval<dg::Offset>,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>,std::less<dg::ADT::DiscreteInterval<dg::Offset>>,std::allocator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
                      ::
                      emplace_hint<dg::ADT::DiscreteInterval<dg::Offset>,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
                                ((map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
                                  *)in_stack_fffffffffffffda0,__pos,
                                 (DiscreteInterval<dg::Offset> *)
                                 CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                                 (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                                  *)in_stack_fffffffffffffd90);
          std::
          set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>::
          ~set((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                *)0x184c39);
          std::allocator<dg::dda::RWNode_*>::~allocator((allocator<dg::dda::RWNode_*> *)0x184c46);
          ppVar2 = std::
                   _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                                 *)0x184c53);
          local_1a8 = (ppVar2->first).start.offset;
          Offset::operator=((Offset *)&local_110,(Offset)local_1a8);
          local_89 = 1;
        }
        else {
          local_1b0 = local_98._M_node;
          bVar1 = DisjunctiveIntervalMap<dg::dda::RWNode*,dg::Offset>::
                  _addValue<std::_Rb_tree_iterator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
                            ((DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *)
                             CONCAT17(uVar5,in_stack_fffffffffffffdc0),in_stack_fffffffffffffdc8,
                             in_stack_fffffffffffffdb8,
                             SUB81((ulong)in_stack_fffffffffffffdb0 >> 0x38,0));
          local_89 = (local_89 & 1) != 0 || bVar1;
          ppVar2 = std::
                   _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                                 *)0x184ce8);
          bVar1 = Offset::operator==(&(ppVar2->first).end,(Offset *)&local_110._M_parent);
          if (bVar1) break;
          ppVar2 = std::
                   _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                   ::operator->((_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                                 *)0x184d18);
          in_stack_fffffffffffffd90 = &(ppVar2->first).end;
          Offset::Offset(&local_1c0,1);
          o.offset._7_1_ = in_stack_fffffffffffffd9f;
          o.offset._0_7_ = in_stack_fffffffffffffd98;
          local_1b8 = (type)Offset::operator+(in_stack_fffffffffffffd90,o);
          Offset::operator=((Offset *)&local_110,(Offset)local_1b8);
          std::
          _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
          ::operator++((_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                        *)in_stack_fffffffffffffd90);
          local_1c8._M_node =
               (_Base_ptr)
               std::
               map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
               ::end(in_stack_fffffffffffffd88);
          bVar1 = std::operator==(&local_98,&local_1c8);
          uVar4 = true;
          if (!bVar1) {
            ppVar2 = std::
                     _Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                     ::operator->((_Rb_tree_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
                                   *)0x184db0);
            uVar4 = Offset::operator>((Offset *)ppVar2,(Offset *)&local_110._M_parent);
          }
          if ((bool)uVar4 != false) {
            std::
            _Rb_tree_const_iterator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>
            ::_Rb_tree_const_iterator(&local_1d0,&local_98);
            local_218 = *local_20;
            local_210 = &local_218;
            local_208 = 1;
            std::allocator<dg::dda::RWNode_*>::allocator((allocator<dg::dda::RWNode_*> *)0x184e17);
            __l_02._M_len._0_7_ = in_stack_fffffffffffffdc0;
            __l_02._M_array = (iterator)in_stack_fffffffffffffdb8;
            __l_02._M_len._7_1_ = uVar5;
            std::
            set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
            ::set(in_stack_fffffffffffffdb0,__l_02,(less<dg::dda::RWNode_*> *)__pos._M_node,
                  (allocator_type *)in_stack_fffffffffffffda0);
            std::
            map<dg::ADT::DiscreteInterval<dg::Offset>,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>,std::less<dg::ADT::DiscreteInterval<dg::Offset>>,std::allocator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
            ::
            emplace_hint<dg::ADT::DiscreteInterval<dg::Offset>&,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
                      ((map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
                        *)in_stack_fffffffffffffda0,__pos,
                       (DiscreteInterval<dg::Offset> *)CONCAT17(uVar4,in_stack_fffffffffffffd98),
                       (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                        *)in_stack_fffffffffffffd90);
            std::
            set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
            ::~set((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                    *)0x184e63);
            std::allocator<dg::dda::RWNode_*>::~allocator((allocator<dg::dda::RWNode_*> *)0x184e6d);
            local_89 = 1;
            break;
          }
          in_stack_fffffffffffffd9f = 0;
        }
      }
      _check(in_RDI);
      local_1 = (bool)(local_89 & 1);
    }
    else {
      local_e8 = *local_20;
      local_e0 = &local_e8;
      local_d8 = 1;
      std::allocator<dg::dda::RWNode_*>::allocator((allocator<dg::dda::RWNode_*> *)0x184a20);
      __l_00._M_len._0_7_ = in_stack_fffffffffffffdc0;
      __l_00._M_array = (iterator)in_stack_fffffffffffffdb8;
      __l_00._M_len._7_1_ = uVar5;
      std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
      ::set(local_18,__l_00,in_stack_fffffffffffffda8,(allocator_type *)in_stack_fffffffffffffda0);
      pVar3 = std::
              map<dg::ADT::DiscreteInterval<dg::Offset>,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>,std::less<dg::ADT::DiscreteInterval<dg::Offset>>,std::allocator<std::pair<dg::ADT::DiscreteInterval<dg::Offset>const,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>>>
              ::
              emplace<dg::ADT::DiscreteInterval<dg::Offset>const&,std::set<dg::dda::RWNode*,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>>
                        ((map<dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>,_std::less<dg::ADT::DiscreteInterval<dg::Offset>_>,_std::allocator<std::pair<const_dg::ADT::DiscreteInterval<dg::Offset>,_std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>_>_>_>
                          *)in_stack_fffffffffffffda0,
                         (DiscreteInterval<dg::Offset> *)
                         CONCAT17(in_stack_fffffffffffffd9f,in_stack_fffffffffffffd98),
                         (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
                          *)in_stack_fffffffffffffd90);
      local_110._M_left = (_Base_ptr)pVar3.first._M_node;
      local_110._M_right._0_1_ = pVar3.second;
      std::set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
      ::~set((set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
              *)0x184a80);
      std::allocator<dg::dda::RWNode_*>::~allocator((allocator<dg::dda::RWNode_*> *)0x184a8d);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool _add(const IntervalT &I, const ValueT &val, bool update = false) {
        if (_mapping.empty()) {
            _mapping.emplace(I, ValuesT{val});
            return true;
        }

        // fast path
        // auto fastit = _mapping.lower_bound(I);
        // if (fastit != _mapping.end() &&
        //    fastit->first == I) {
        //    return _addValue(fastit, val, update);
        //}

        // XXX: pass the lower_bound iterator from the fast path
        // so that we do not search the mapping again
        bool changed = splitExtBorders(I);
        _check();

        // splitExtBorders() arranged the intervals such
        // that some interval starts with ours
        // and some interval ends with ours.
        // Now we just create new intervals in the gaps
        // and add values to the intervals that we have

        // FIXME: splitExtBorders() can return the iterator,
        // so that we do not need to search the map again.
        auto it = _find_ge(I);
        assert(!changed || it != _mapping.end());

        // we do not have any overlapping interval
        if (it == _mapping.end() || I.end < it->first.start) {
            assert(!overlaps(I) && "Bug in add() or in overlaps()");
            _mapping.emplace(I, ValuesT{val});
            return true;
        }

        auto rest = I;
        assert(rest.end >= it->first.start); // we must have some overlap here
        while (it != _mapping.end()) {
            if (rest.start < it->first.start) {
                // add the gap interval
                _mapping.emplace_hint(
                        it, IntervalT(rest.start, it->first.start - 1),
                        ValuesT{val});
                rest.start = it->first.start;
                changed = true;
            } else {
                // update the existing interval and shift
                // to the next interval
                assert(rest.start == it->first.start);
                changed |= _addValue(it, val, update);
                if (it->first.end == rest.end)
                    break;

                rest.start = it->first.end + 1;
                ++it;

                // our interval spans to the right
                // after the last covered interval
                if (it == _mapping.end() || it->first.start > rest.end) {
                    _mapping.emplace_hint(it, rest, ValuesT{val});
                    changed = true;
                    break;
                }
            }
        }

        _check();
        return changed;
    }